

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenChar(Lexer *this)

{
  bool bVar1;
  Lexer *in_RSI;
  Position local_80;
  undefined1 local_62 [26];
  Position local_48;
  Position local_30;
  Lexer *this_local;
  unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *tok;
  
  this_local = this;
  nextChar(in_RSI);
  if (in_RSI->currentChar == 0x5c) {
    local_30.endIndex._7_1_ = 0;
    nextTokenStringEscapeCode(this);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
    if (bVar1) {
      local_30.endIndex._7_1_ = 1;
    }
    local_30.endIndex._0_4_ = (uint)bVar1;
    if ((local_30.endIndex._7_1_ & 1) == 0) {
      std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::~unique_ptr
                ((unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)this);
    }
    if ((uint)local_30.endIndex != 0) {
      return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
             (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
    }
  }
  nextChar(in_RSI);
  if (in_RSI->currentChar == 0x27) {
    nextChar(in_RSI);
    local_62._0_2_ = 0x10;
    getCurrentCursor(&local_80,in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_62);
  }
  else {
    local_30.line._6_2_ = 2;
    local_30.line._0_4_ = 4;
    getCurrentCursor((Position *)(local_62 + 2),in_RSI);
    Position::Position(&local_48,local_62._2_8_,in_RSI->currentEndIndex,in_RSI->currentEndIndex);
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)&local_30.startIndex,(LexerErrorCode *)((long)&local_30.line + 6),&local_30)
    ;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)in_RSI);
    std::
    unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                   *)&local_30.startIndex);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenChar() noexcept {
  nextChar(); //eat '
  
  if (currentChar == '\\') {
    std::unique_ptr<Token> tok = nextTokenStringEscapeCode();
    if (tok)
      return tok; // error forwarding
  }

  nextChar();
  if (currentChar != '\'')
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_CHAR_INVALID_END, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  nextChar(); // eat '

  return std::make_unique<Token>(currentToken, TokenType::TOK_CHAR, getCurrentCursor());
}